

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O3

void __thiscall CLayerTiles::PrepareForSave(CLayerTiles *this)

{
  byte bVar1;
  CEditor *pCVar2;
  bool bVar3;
  CEditorImage *pCVar4;
  CTile *pCVar5;
  uchar uVar6;
  uchar *puVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  CLayerTiles *pCVar11;
  char cVar12;
  CLayerTiles *pCVar13;
  CLayerTiles *pCVar14;
  CEditorImage *in_R8;
  uchar uVar15;
  ulong in_R9;
  CLayerTiles *unaff_R12;
  CEditorImage *unaff_R13;
  uint uVar16;
  ulong uVar18;
  ulong uVar17;
  
  iVar10 = this->m_Height;
  pCVar11 = (CLayerTiles *)(long)iVar10;
  pCVar14 = this;
  if (0 < (long)pCVar11) {
    uVar16 = this->m_Width;
    puVar7 = &this->m_pTiles->m_Flags;
    pCVar13 = (CLayerTiles *)0x0;
    do {
      if (0 < (int)uVar16) {
        pCVar14 = (CLayerTiles *)0x0;
        do {
          puVar7[(long)pCVar14 * 4] = puVar7[(long)pCVar14 * 4] & 0xb;
          if (puVar7[(long)pCVar14 * 4 + -1] == '\0') {
            puVar7[(long)pCVar14 * 4] = '\0';
          }
          pCVar14 = (CLayerTiles *)((long)&(pCVar14->super_CLayer)._vptr_CLayer + 1);
        } while ((CLayerTiles *)(ulong)uVar16 != pCVar14);
      }
      pCVar13 = (CLayerTiles *)((long)&(pCVar13->super_CLayer)._vptr_CLayer + 1);
      puVar7 = puVar7 + (long)(ulong)uVar16 * 4;
    } while (pCVar13 != pCVar11);
    iVar8 = this->m_Image;
    if (((this->m_Color).a == 0xff && (long)iVar8 != -1) && 0 < iVar10) {
      uVar16 = this->m_Width;
      uVar18 = (ulong)uVar16;
      pCVar2 = (this->super_CLayer).m_pEditor;
      puVar7 = &this->m_pTiles->m_Flags;
      pCVar14 = (CLayerTiles *)0x0;
      do {
        if (0 < (int)uVar16) {
          in_R8 = (pCVar2->m_Map).m_lImages.list[iVar8];
          in_R9 = 0;
          do {
            puVar7[in_R9 * 4] = puVar7[in_R9 * 4] | in_R8->m_aTileFlags[puVar7[in_R9 * 4 + -1]];
            in_R9 = in_R9 + 1;
          } while (uVar18 != in_R9);
        }
        pCVar14 = (CLayerTiles *)((long)&(pCVar14->super_CLayer)._vptr_CLayer + 1);
        puVar7 = puVar7 + uVar18 * 4;
      } while (pCVar14 != pCVar11);
      goto LAB_001a618e;
    }
  }
  uVar18 = (ulong)(uint)this->m_Width;
LAB_001a618e:
  uVar15 = (uchar)in_R9;
  uVar16 = (int)uVar18 * iVar10;
  uVar17 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    iVar10 = 0;
    pCVar14 = unaff_R12;
    in_R8 = unaff_R13;
  }
  else {
    pCVar5 = this->m_pTiles;
    uVar9 = 0;
    cVar12 = -1;
    iVar10 = 0;
    do {
      if (cVar12 == -1) {
        pCVar4 = (CEditorImage *)(ulong)pCVar5[uVar9].m_Flags;
LAB_001a61d1:
        in_R8 = pCVar4;
        in_R9 = (ulong)pCVar5[uVar9].m_Reserved;
        iVar10 = iVar10 + 1;
        cVar12 = '\0';
        pCVar14 = (CLayerTiles *)(ulong)pCVar5[uVar9].m_Index;
      }
      else {
        bVar1 = pCVar5[uVar9].m_Flags;
        pCVar4 = (CEditorImage *)(ulong)bVar1;
        if ((pCVar5[uVar9].m_Index != (byte)pCVar14) || (bVar1 != (byte)in_R8)) goto LAB_001a61d1;
        cVar12 = cVar12 + '\x01';
        in_R8 = (CEditorImage *)((ulong)in_R8 & 0xffffffff);
        pCVar14 = (CLayerTiles *)((ulong)pCVar14 & 0xffffffff);
      }
      uVar15 = (uchar)in_R9;
      uVar9 = uVar9 + 1;
    } while (uVar17 != uVar9);
  }
  if (this->m_pSaveTiles != (CTile *)0x0) {
    operator_delete__(this->m_pSaveTiles);
    uVar18 = (ulong)(uint)this->m_Width;
    pCVar11 = (CLayerTiles *)(ulong)(uint)this->m_Height;
    uVar17 = (ulong)(uint)(this->m_Height * this->m_Width);
  }
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar9 = (long)iVar10 * 4;
  }
  pCVar5 = (CTile *)operator_new__(uVar9);
  this->m_pSaveTiles = pCVar5;
  this->m_SaveTilesSize = iVar10 << 2;
  if (-1 < (int)uVar17) {
    uVar6 = 0xff;
    iVar10 = 0;
    uVar9 = 0;
    do {
      if (((uVar6 == 0xff || uVar9 == uVar17) || (this->m_pTiles[uVar9].m_Index != (uchar)pCVar14))
         || (this->m_pTiles[uVar9].m_Flags != (uchar)in_R8)) {
        iVar8 = iVar10;
        if (uVar9 != 0) {
          pCVar5 = this->m_pSaveTiles;
          iVar8 = iVar10 + 1;
          pCVar5[iVar10].m_Index = (uchar)pCVar14;
          pCVar5[iVar10].m_Flags = (uchar)in_R8;
          pCVar5[iVar10].m_Skip = uVar6;
          pCVar5[iVar10].m_Reserved = uVar15;
          uVar18 = (ulong)(uint)this->m_Width;
          pCVar11 = (CLayerTiles *)(ulong)(uint)this->m_Height;
        }
        uVar17 = (ulong)(uint)((int)pCVar11 * (int)uVar18);
        iVar10 = iVar8;
        if (uVar9 != uVar17) {
          pCVar5 = this->m_pTiles;
          pCVar14 = (CLayerTiles *)(ulong)pCVar5[uVar9].m_Index;
          in_R8 = (CEditorImage *)(ulong)pCVar5[uVar9].m_Flags;
          uVar15 = pCVar5[uVar9].m_Reserved;
          uVar6 = '\0';
        }
      }
      else {
        uVar6 = uVar6 + '\x01';
        uVar17 = (ulong)(uint)((int)pCVar11 * (int)uVar18);
      }
      bVar3 = (long)uVar9 < (long)(int)uVar17;
      uVar9 = uVar9 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void CLayerTiles::PrepareForSave()
{
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			m_pTiles[y*m_Width+x].m_Flags &= TILEFLAG_VFLIP|TILEFLAG_HFLIP|TILEFLAG_ROTATE;
			if(m_pTiles[y*m_Width+x].m_Index == 0)
				m_pTiles[y*m_Width+x].m_Flags = 0;
		}

	if(m_Image != -1 && m_Color.a == 255)
	{
		for(int y = 0; y < m_Height; y++)
			for(int x = 0; x < m_Width; x++)
				m_pTiles[y*m_Width+x].m_Flags |= m_pEditor->m_Map.m_lImages[m_Image]->m_aTileFlags[m_pTiles[y*m_Width+x].m_Index];
	}

	int NumSaveTiles = 0; // number of unique tiles that we have to save
	CTile Tile; // current tile to be duplicated
	Tile.m_Skip = MAX_SKIP; // tell the code that we can't skip the first tile

	int NumHitMaxSkip = -1;

	for(int i = 0; i < m_Width * m_Height; i++)
	{
		// we can only store MAX_SKIP empty tiles in one tile
		if(Tile.m_Skip == MAX_SKIP)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
			NumHitMaxSkip++;
		}
		// tile is different from last one? - can't skip it
		else if(m_pTiles[i].m_Index != Tile.m_Index || m_pTiles[i].m_Flags != Tile.m_Flags)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
		}
		// if the tile is the same as the previous one - no need to
		// save it separately
		else
			Tile.m_Skip++;
	}

	if(m_pSaveTiles)
		delete [] m_pSaveTiles;

	m_pSaveTiles = new CTile[NumSaveTiles];
	m_SaveTilesSize = sizeof(CTile) * NumSaveTiles;

	int NumWrittenSaveTiles = 0;
	Tile.m_Skip = MAX_SKIP;
	for(int i = 0; i < m_Width * m_Height + 1; i++)
	{
		// again, if an tile is the same as the previous one
		// and we have place to store it, skip it!
		// if we are at the end of the layer, write one more tile
		if(i != m_Width * m_Height && Tile.m_Skip != MAX_SKIP && m_pTiles[i].m_Index == Tile.m_Index && m_pTiles[i].m_Flags == Tile.m_Flags)
		{
			Tile.m_Skip++;
		}
		// tile is not skippable
		else
		{
			// if this is not the first tile, we have to save the previous
			// tile beforehand
			if(i != 0)
				m_pSaveTiles[NumWrittenSaveTiles++] = Tile;

			// if this isn't the last tile, store it so we can check how
			// many tiles to skip
			if(i != m_Width * m_Height)
			{
				Tile = m_pTiles[i];
				Tile.m_Skip = 0;
			}
		}
	}
}